

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  IfcConversionBasedUnit *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcConversionBasedUnit");
  IfcNamedUnit::IfcNamedUnit(&this->super_IfcNamedUnit,&PTR_construction_vtable_24__00f9ed48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConversionBasedUnit,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcConversionBasedUnit,_2UL> *)
             &(this->super_IfcNamedUnit).field_0x38,&PTR_construction_vtable_24__00f9ed68);
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0xf9ece0;
  *(undefined8 *)&this->field_0x70 = 0xf9ed30;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0xf9ed08;
  std::__cxx11::string::string((string *)&(this->super_IfcNamedUnit).field_0x48);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit>::Lazy
            (&this->ConversionFactor,(LazyObject *)0x0);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}